

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepWriteParameters(void *arkode_mem,FILE *fp)

{
  int iVar1;
  char *pcVar2;
  size_t sStack_30;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepWriteParameters",&ark_mem,&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = arkWriteParameters(ark_mem,fp);
  if (iVar1 != 0) {
    arkProcessError(ark_mem,-0x15,"ARKode::ARKStep","ARKStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return iVar1;
  }
  fwrite("ARKStep time step module parameters:\n",0x25,1,(FILE *)fp);
  fprintf((FILE *)fp,"  Method order %i\n",(ulong)(uint)step_mem->q);
  if (step_mem->linear != 0) {
    fwrite("  Linear implicit problem",0x19,1,(FILE *)fp);
    if (step_mem->linear_timedep == 0) {
      pcVar2 = " (time-independent Jacobian)\n";
      sStack_30 = 0x1d;
    }
    else {
      pcVar2 = " (time-dependent Jacobian)\n";
      sStack_30 = 0x1b;
    }
    fwrite(pcVar2,sStack_30,1,(FILE *)fp);
  }
  if (step_mem->explicit == 0) {
    if (step_mem->implicit == 0) goto LAB_00499885;
    pcVar2 = "  Implicit integrator\n";
  }
  else {
    if (step_mem->implicit != 0) {
      pcVar2 = "  ImEx integrator\n";
      sStack_30 = 0x12;
      goto LAB_0049988e;
    }
LAB_00499885:
    pcVar2 = "  Explicit integrator\n";
  }
  sStack_30 = 0x16;
LAB_0049988e:
  fwrite(pcVar2,sStack_30,1,(FILE *)fp);
  if (step_mem->implicit != 0) {
    fprintf((FILE *)fp,"  Implicit predictor method = %i\n",(ulong)(uint)step_mem->predictor);
    fprintf((FILE *)fp,"  Implicit solver tolerance coefficient = %.16g\n",step_mem->nlscoef);
    fprintf((FILE *)fp,"  Maximum number of nonlinear corrections = %i\n",
            (ulong)(uint)step_mem->maxcor);
    fprintf((FILE *)fp,"  Nonlinear convergence rate constant = %.16g\n",step_mem->crdown);
    fprintf((FILE *)fp,"  Nonlinear divergence tolerance = %.16g\n",step_mem->rdiv);
    fprintf((FILE *)fp,"  Gamma factor LSetup tolerance = %.16g\n",step_mem->dgmax);
    fprintf((FILE *)fp,"  Number of steps between LSetup calls = %i\n",(ulong)(uint)step_mem->msbp);
  }
  fputc(10,(FILE *)fp);
  return 0;
}

Assistant:

int ARKStepWriteParameters(void *arkode_mem, FILE *fp)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int flag, retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepWriteParameters",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* output ARKode infrastructure parameters first */
  flag = arkWriteParameters(ark_mem, fp);
  if (flag != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepWriteParameters",
                    "Error writing ARKode infrastructure parameters");
    return(flag);
  }

  /* print integrator parameters to file */
  fprintf(fp, "ARKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n",step_mem->q);
  if (step_mem->linear) {
    fprintf(fp, "  Linear implicit problem");
    if (step_mem->linear_timedep) {
      fprintf(fp, " (time-dependent Jacobian)\n");
    } else {
      fprintf(fp, " (time-independent Jacobian)\n");
    }
  }
  if (step_mem->explicit && step_mem->implicit) {
    fprintf(fp, "  ImEx integrator\n");
  } else if (step_mem->implicit) {
    fprintf(fp, "  Implicit integrator\n");
  } else {
    fprintf(fp, "  Explicit integrator\n");
  }

  if (step_mem->implicit) {
    fprintf(fp, "  Implicit predictor method = %i\n",step_mem->predictor);
    fprintf(fp, "  Implicit solver tolerance coefficient = %"RSYM"\n",step_mem->nlscoef);
    fprintf(fp, "  Maximum number of nonlinear corrections = %i\n",step_mem->maxcor);
    fprintf(fp, "  Nonlinear convergence rate constant = %"RSYM"\n",step_mem->crdown);
    fprintf(fp, "  Nonlinear divergence tolerance = %"RSYM"\n",step_mem->rdiv);
    fprintf(fp, "  Gamma factor LSetup tolerance = %"RSYM"\n",step_mem->dgmax);
    fprintf(fp, "  Number of steps between LSetup calls = %i\n",step_mem->msbp);
  }
  fprintf(fp, "\n");

  return(ARK_SUCCESS);
}